

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

void __thiscall
EthUdpPort::EthUdpPort
          (EthUdpPort *this,int portNum,string *serverIP,bool forceFwBridge,ostream *debugStream,
          EthCallbackType cb)

{
  int iVar1;
  SocketInternals *this_00;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_29;
  
  EthBasePort::EthBasePort(&this->super_EthBasePort,portNum,forceFwBridge,debugStream,cb);
  (this->super_EthBasePort).super_BasePort._vptr_BasePort = (_func_int **)&PTR_Init_00122a00;
  std::__cxx11::string::string((string *)&this->ServerIP,(string *)serverIP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->MulticastIP,"224.0.0.100",&local_29);
  this->UDP_port = 0x572;
  this_00 = (SocketInternals *)operator_new(0x68);
  SocketInternals::SocketInternals(this_00,debugStream);
  this->sockPtr = this_00;
  iVar1 = (**(this->super_EthBasePort).super_BasePort._vptr_BasePort)(this);
  pcVar3 = "Initialization failed";
  if ((char)iVar1 != '\0') {
    pcVar3 = "Initialization done";
  }
  poVar2 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

EthUdpPort::EthUdpPort(int portNum, const std::string &serverIP, bool forceFwBridge, std::ostream &debugStream, EthCallbackType cb):
    EthBasePort(portNum, forceFwBridge, debugStream, cb),
    ServerIP(serverIP),
    MulticastIP(ETH_UDP_MULTICAST_DEFAULT_IP),
    UDP_port(1394)
{
    sockPtr = new SocketInternals(debugStream);
    if (Init())
        outStr << "Initialization done" << std::endl;
    else
        outStr << "Initialization failed" << std::endl;
}